

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

bool __thiscall
cmWorkerPool::JobT::RunProcess
          (JobT *this,ProcessResultT *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *workingDirectory)

{
  bool bVar1;
  pointer pcVar2;
  reference this_00;
  pointer this_01;
  cmWorkerPoolWorker *wrk;
  string *workingDirectory_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_local;
  ProcessResultT *result_local;
  JobT *this_local;
  
  pcVar2 = std::unique_ptr<cmWorkerPoolInternal,_std::default_delete<cmWorkerPoolInternal>_>::
           operator->(&this->Pool_->Int_);
  this_00 = std::
            vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
            ::at(&pcVar2->Workers,(ulong)this->WorkerIndex_);
  this_01 = std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>::get
                      (this_00);
  bVar1 = cmWorkerPoolWorker::RunProcess(this_01,result,command,workingDirectory);
  return bVar1;
}

Assistant:

bool cmWorkerPool::JobT::RunProcess(ProcessResultT& result,
                                    std::vector<std::string> const& command,
                                    std::string const& workingDirectory)
{
  // Get worker by index
  auto* wrk = Pool_->Int_->Workers.at(WorkerIndex_).get();
  return wrk->RunProcess(result, command, workingDirectory);
}